

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall tf::TFProfObserver::summary(TFProfObserver *this,ostream *os)

{
  size_t *psVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  ostream *poVar11;
  pointer pvVar12;
  pointer *ppvVar13;
  long lVar14;
  long *plVar15;
  pointer pvVar16;
  ulong uVar17;
  size_t sVar18;
  TaskSummary *pTVar19;
  ulong uVar20;
  ulong uVar21;
  long unaff_R13;
  long lVar22;
  WorkerSummary ws;
  Summary summary;
  
  Summary::Summary(&summary);
  pvVar16 = (this->_timeline).segments.
            super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar12 = (this->_timeline).segments.
            super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = ((long)pvVar12 - (long)pvVar16) / 0x18;
  ppvVar13 = (pointer *)
             ((long)&(pvVar16->
                     super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                     )._M_impl.super__Vector_impl_data + 8);
  lVar22 = 0;
  uVar17 = 0;
  do {
    if (uVar9 == uVar17) {
LAB_0010a458:
      poVar11 = std::operator<<(os,"==Observer ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11,": ");
      num_workers(this);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11," workers completed ");
      num_tasks(this);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11," tasks in ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::operator<<(poVar11," us\n");
      Summary::dump(&summary,os);
      std::
      _Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
      ::~_Vector_base(&summary.wsum.
                       super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                     );
      return;
    }
    if (*ppvVar13 != ((_Vector_impl_data *)(ppvVar13 + -1))->_M_start) {
      if (uVar9 != uVar17) {
        bVar7 = false;
        bVar8 = false;
        for (; uVar17 < (ulong)(((long)pvVar12 - (long)pvVar16) / 0x18); uVar17 = uVar17 + 1) {
          for (uVar9 = 0;
              lVar3 = *(long *)&pvVar16[uVar17].
                                super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                ._M_impl.super__Vector_impl_data,
              uVar9 < (ulong)(((long)*(pointer *)
                                      ((long)&pvVar16[uVar17].
                                              super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                              ._M_impl.super__Vector_impl_data + 8) - lVar3) / 0x18)
              ; uVar9 = uVar9 + 1) {
            lVar14 = uVar9 * 0x18;
            if (*(long *)(lVar3 + lVar14) != *(long *)(lVar3 + 8 + lVar14)) {
              WorkerSummary::WorkerSummary(&ws);
              lVar3 = *(long *)&(this->_timeline).segments.
                                super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              lVar4 = *(long *)(lVar3 + lVar14);
              ws.count = (*(long *)(lVar3 + 8 + lVar14) - lVar4) / 0x38;
              plVar15 = (long *)(lVar4 + 0x30);
              for (sVar18 = 0; ws.count != sVar18; sVar18 = sVar18 + 1) {
                lVar3 = plVar15[-1];
                if (lVar3 < unaff_R13) {
                  unaff_R13 = lVar3;
                }
                if (!bVar8) {
                  bVar8 = true;
                  unaff_R13 = lVar3;
                }
                lVar14 = *plVar15;
                if (lVar22 <= lVar14) {
                  lVar22 = lVar14;
                }
                if (!bVar7) {
                  bVar7 = true;
                  lVar22 = lVar14;
                }
                uVar10 = (lVar14 - lVar3) / 1000;
                iVar2 = (int)plVar15[-2];
                pTVar19 = summary.tsum._M_elems + iVar2;
                sVar5 = pTVar19->count;
                pTVar19->count = sVar5 + 1;
                psVar1 = &summary.tsum._M_elems[iVar2].total_span;
                *psVar1 = *psVar1 + uVar10;
                uVar21 = uVar10;
                uVar20 = uVar10;
                if (sVar5 != 0) {
                  uVar20 = summary.tsum._M_elems[iVar2].min_span;
                  uVar21 = summary.tsum._M_elems[iVar2].max_span;
                  if (uVar10 <= uVar20) {
                    uVar20 = uVar10;
                  }
                  if (uVar21 < uVar10) {
                    uVar21 = uVar10;
                  }
                }
                summary.tsum._M_elems[iVar2].min_span = uVar20;
                summary.tsum._M_elems[iVar2].max_span = uVar21;
                ws.total_span = ws.total_span + uVar10;
                uVar20 = uVar10;
                uVar21 = uVar10;
                if (sVar18 != 0) {
                  if (uVar10 <= ws.min_span) {
                    ws.min_span = uVar10;
                  }
                  uVar20 = ws.max_span;
                  uVar21 = ws.min_span;
                  if (ws.max_span < uVar10) {
                    uVar20 = uVar10;
                  }
                }
                ws.min_span = uVar21;
                sVar5 = ws.tsum._M_elems[iVar2].count;
                ws.tsum._M_elems[iVar2].count = sVar5 + 1;
                psVar1 = &ws.tsum._M_elems[iVar2].total_span;
                *psVar1 = *psVar1 + uVar10;
                uVar21 = uVar10;
                if (sVar5 != 0) {
                  uVar21 = ws.tsum._M_elems[iVar2].min_span;
                  uVar6 = ws.tsum._M_elems[iVar2].max_span;
                  if (uVar10 <= uVar21) {
                    uVar21 = uVar10;
                  }
                  if (uVar10 <= uVar6) {
                    uVar10 = uVar6;
                  }
                }
                ws.tsum._M_elems[iVar2].min_span = uVar21;
                ws.tsum._M_elems[iVar2].max_span = uVar10;
                plVar15 = plVar15 + 7;
                ws.max_span = uVar20;
              }
              ws.id = uVar17;
              ws.level = uVar9;
              std::
              vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
              ::push_back(&summary.wsum,&ws);
              pvVar16 = (this->_timeline).segments.
                        super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
          }
          pvVar12 = (this->_timeline).segments.
                    super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      goto LAB_0010a458;
    }
    uVar17 = uVar17 + 1;
    ppvVar13 = ppvVar13 + 3;
  } while( true );
}

Assistant:

inline void TFProfObserver::summary(std::ostream& os) const {

  using namespace std::chrono;
  
  Summary summary;
  std::optional<observer_stamp_t> view_beg, view_end;

  // find the first non-empty worker
  size_t first;
  for(first = 0; first<_timeline.segments.size(); ++first) {
    if(_timeline.segments[first].size() > 0) { 
      break; 
    }
  }
  
  // not timeline data to dump
  if(first == _timeline.segments.size()) {
    goto end_of_summary;
  }

  for(size_t w=first; w<_timeline.segments.size(); w++) {
    for(size_t l=0; l<_timeline.segments[w].size(); l++) {

      if(_timeline.segments[w][l].empty()) {
        continue;
      }

      // worker w at level l
      WorkerSummary ws;
      ws.id = w;
      ws.level = l;
      ws.count = _timeline.segments[w][l].size();
      
      // scan all tasks at level l
      for(size_t i=0; i<_timeline.segments[w][l].size(); ++i) {
        
        // update the entire span
        auto& s = _timeline.segments[w][l][i];
        view_beg = view_beg ? (std::min)(*view_beg, s.beg) : s.beg;
        view_end = view_end ? (std::max)(*view_end, s.end) : s.end;
        
        // update the task summary
        size_t t = duration_cast<microseconds>(s.end - s.beg).count();

        auto& x = summary.tsum[static_cast<int>(s.type)];
        x.count += 1;
        x.total_span += t;
        x.min_span = (x.count == 1) ? t : (std::min)(t, x.min_span);
        x.max_span = (x.count == 1) ? t : (std::max)(t, x.max_span);

        // update the worker summary
        ws.total_span += t;
        ws.min_span = (i == 0) ? t : (std::min)(t, ws.min_span);
        ws.max_span = (i == 0) ? t : (std::max)(t, ws.max_span);

        auto&y = ws.tsum[static_cast<int>(s.type)];
        y.count += 1;
        y.total_span += t;
        y.min_span = (y.count == 1) ? t : (std::min)(t, y.min_span);
        y.max_span = (y.count == 1) ? t : (std::max)(t, y.max_span);
        
        // update the delay
        //if(i) {
        //  size_t d = duration_cast<nanoseconds>(
        //    s.beg - _timeline.segments[w][l][i-1].end
        //  ).count();
        //  ws.total_delay += d;
        //  ws.min_delay = (i == 1) ? d : std::min(ws.min_delay, d);
        //  ws.max_delay = (i == 1) ? d : std::max(ws.max_delay, d);
        //}
      }
      summary.wsum.push_back(ws);
    }
  }

  end_of_summary:

  size_t view = 0;
  if(view_beg && view_end) {
    view = duration_cast<microseconds>(*view_end - *view_beg).count();
  }

  os << "==Observer " << _timeline.uid << ": "
     << num_workers() << " workers completed "
     << num_tasks() << " tasks in "
     << view << " us\n";

  summary.dump(os);
}